

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

void lws_cmdline_option_handle_builtin(int argc,char **argv,lws_context_creation_info *info)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  int local_34;
  
  local_34 = 0x407;
  piVar2 = &builtins_rel;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    __nptr = lws_cmdline_option(argc,argv,(char *)((long)&builtins_rel + (long)*piVar2));
    iVar1 = local_34;
    if (__nptr != (char *)0x0) {
      iVar1 = atoi(__nptr);
      if ((int)lVar3 != 0) {
        if ((int)lVar3 == 2) {
          info->udp_loss_sim_rx_pc = (uint8_t)iVar1;
          iVar1 = local_34;
        }
        else {
          info->udp_loss_sim_tx_pc = (uint8_t)iVar1;
          iVar1 = local_34;
        }
      }
    }
    local_34 = iVar1;
    piVar2 = piVar2 + 1;
  }
  lws_set_log_level(local_34,(_func_void_int_char_ptr *)0x0);
  return;
}

Assistant:

void
lws_cmdline_option_handle_builtin(int argc, const char **argv,
				  struct lws_context_creation_info *info)
{
	const char *p;
	int n, m, logs = LLL_USER | LLL_ERR | LLL_WARN | LLL_NOTICE;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(builtins); n++) {
		p = lws_cmdline_option(argc, argv, builtins[n]);
		if (!p)
			continue;

		m = atoi(p);

		switch (n) {
		case 0:
			logs = m;
			break;
		case 1:
			info->udp_loss_sim_tx_pc = m;
			break;
		case 2:
			info->udp_loss_sim_rx_pc = m;
			break;
		}
	}

	lws_set_log_level(logs, NULL);
}